

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

void Abc_NtkDfsBoxes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  Abc_Ntk_t *pAVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pNode_00;
  int in_EDX;
  int Fill;
  int iVar4;
  Vec_Int_t *p;
  
  uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar2 != 2) {
    if ((uVar2 != 7) && (uVar2 != 10 && (*(uint *)&pNode->field_0x14 & 0xe) != 8)) {
      __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                    ,0x51,"void Abc_NtkDfsBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    p = &pNode->pNtk->vTravIds;
    iVar4 = pNode->Id;
    Vec_IntFillExtra(p,iVar4 + 1,in_EDX);
    iVar3 = Vec_IntEntry(p,iVar4);
    pAVar1 = pNode->pNtk;
    iVar4 = pAVar1->nTravIds;
    if (iVar3 != iVar4) {
      iVar3 = pNode->Id;
      Vec_IntFillExtra(&pAVar1->vTravIds,iVar3 + 1,Fill);
      if ((-1 < (long)iVar3) && (iVar3 < (pAVar1->vTravIds).nSize)) {
        (pAVar1->vTravIds).pArray[iVar3] = iVar4;
        for (iVar4 = 0; iVar4 < (pNode->vFanins).nSize; iVar4 = iVar4 + 1) {
          pNode_00 = Abc_ObjFaninReal(pNode,iVar4);
          Abc_NtkDfsBoxes_rec(pNode_00,vNodes);
        }
        Vec_PtrPush(vNodes,pNode);
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsBoxes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_ObjIsPi(pNode) )
        return;
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin of the node
    Abc_ObjForEachFaninReal( pNode, pFanin, i )
        Abc_NtkDfsBoxes_rec( pFanin, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}